

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  LogMessage *pLVar1;
  LogMessage local_40;
  Voidify local_29;
  Extension *local_28;
  Extension *ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  ext._4_4_ = number;
  pEStack_18 = this;
  local_28 = FindOrNull(this,number);
  if (local_28 == (Extension *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if ((local_28->is_repeated & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0xe1,"!ext->is_repeated");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    this_local._7_1_ = (bool)(((byte)local_28->field_0xa >> 1 & 1 ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) return false;
  ABSL_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}